

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void vkb::destroy_instance(Instance *instance)

{
  VulkanFunctions *pVVar1;
  Instance *instance_local;
  
  if (instance->instance != (VkInstance)0x0) {
    if (instance->debug_messenger != (VkDebugUtilsMessengerEXT)0x0) {
      destroy_debug_utils_messenger
                (instance->instance,instance->debug_messenger,instance->allocation_callbacks);
    }
    pVVar1 = detail::vulkan_functions();
    (*pVVar1->fp_vkDestroyInstance)(instance->instance,instance->allocation_callbacks);
  }
  return;
}

Assistant:

void destroy_instance(Instance const& instance) {
    if (instance.instance != VK_NULL_HANDLE) {
        if (instance.debug_messenger != VK_NULL_HANDLE)
            destroy_debug_utils_messenger(instance.instance, instance.debug_messenger, instance.allocation_callbacks);
        detail::vulkan_functions().fp_vkDestroyInstance(instance.instance, instance.allocation_callbacks);
    }
}